

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

deUint32 vkt::wsi::anon_unknown_0::chooseQueueFamilyIndex
                   (InstanceInterface *vki,VkPhysicalDevice physicalDevice,VkSurfaceKHR surface)

{
  deUint32 dVar1;
  bool bVar2;
  NotSupportedError *this;
  const_reference pvVar3;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> supportedFamilyIndices;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  VkSurfaceKHR surface_local;
  
  supportedFamilyIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)physicalDevice;
  getSupportedQueueFamilyIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,vki,physicalDevice,
             surface);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  if (!bVar2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
    dVar1 = *pvVar3;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    return dVar1;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Device doesn\'t support presentation",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
             ,0x7c);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

deUint32 chooseQueueFamilyIndex (const vk::InstanceInterface& vki, vk::VkPhysicalDevice physicalDevice, vk::VkSurfaceKHR surface)
{
	const vector<deUint32>	supportedFamilyIndices	= getSupportedQueueFamilyIndices(vki, physicalDevice, surface);

	if (supportedFamilyIndices.empty())
		TCU_THROW(NotSupportedError, "Device doesn't support presentation");

	return supportedFamilyIndices[0];
}